

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O0

int parse_import_description(wasmbox_input_stream_t *ins,wasmbox_module_t *mod)

{
  wasm_u8_t wVar1;
  int iVar2;
  wasmbox_value_type_t local_34;
  wasmbox_value_type_t value_type;
  wasmbox_limit_t limit;
  wasm_u32_t v;
  wasm_u8_t type;
  wasmbox_module_t *mod_local;
  wasmbox_input_stream_t *ins_local;
  
  limit.max._3_1_ = wasmbox_input_stream_read_u8(ins);
  switch(limit.max._3_1_) {
  case '\0':
    wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
    ins_local._4_4_ = 0;
    break;
  case '\x01':
    wVar1 = wasmbox_input_stream_read_u8(ins);
    if (wVar1 != 'p') {
      __assert_fail("wasmbox_input_stream_read_u8(ins) == 0x70",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/imasahiro[P]wasmbox/src/wasmbox.c"
                    ,0x4c8,
                    "int parse_import_description(wasmbox_input_stream_t *, wasmbox_module_t *)");
    }
    ins_local._4_4_ = parse_limit(ins,(wasmbox_limit_t *)&stack0xffffffffffffffd0);
    break;
  case '\x02':
    ins_local._4_4_ = parse_limit(ins,(wasmbox_limit_t *)&stack0xffffffffffffffd0);
    break;
  case '\x03':
    iVar2 = parse_value_type(ins,&local_34);
    if (iVar2 == 0) {
      limit.max._3_1_ = wasmbox_input_stream_read_u8(ins);
      if (((limit.max._3_1_ != '\0') && (limit.max._3_1_ != '\x01')) && (limit.max._3_1_ != '\x02'))
      {
        __assert_fail("type == 0x00 || type == 0x01 || type == 0x02",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/imasahiro[P]wasmbox/src/wasmbox.c"
                      ,0x4d2,
                      "int parse_import_description(wasmbox_input_stream_t *, wasmbox_module_t *)");
      }
      ins_local._4_4_ = 0;
    }
    else {
      ins_local._4_4_ = -1;
    }
    break;
  default:
    ins_local._4_4_ = -1;
  }
  return ins_local._4_4_;
}

Assistant:

static int parse_import_description(wasmbox_input_stream_t *ins,
                                    wasmbox_module_t *mod) {
  wasm_u8_t type = wasmbox_input_stream_read_u8(ins);
  wasm_u32_t v;
  wasmbox_limit_t limit;
  wasmbox_value_type_t value_type;
  switch (type) {
    case 0x00: // func x:typeidx
      v = wasmbox_parse_unsigned_leb128(ins->data + ins->index, &ins->index,
                                        ins->length);
      return 0;
    case 0x01: // table x:tabletype
      assert(wasmbox_input_stream_read_u8(ins) == 0x70);
      return parse_limit(ins, &limit);
    case 0x02: // mem x:memtype
      return parse_limit(ins, &limit);
    case 0x03: // global x:globaltype
      if (parse_value_type(ins, &value_type)) {
        return -1;
      }
      type = wasmbox_input_stream_read_u8(ins);
      assert(type == 0x00 /* const */ || type == 0x01 /* var */ ||
             type == 0x02 /* mutable */);
      return 0;
    default:
      return -1;
  }
}